

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

JavaType google::protobuf::compiler::java::GetJavaType(FieldDescriptor *field)

{
  Type TVar1;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = field;
  TVar1 = GetType(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
    field_local._4_4_ = JAVATYPE_DOUBLE;
    break;
  case TYPE_FLOAT:
    field_local._4_4_ = JAVATYPE_FLOAT;
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    field_local._4_4_ = JAVATYPE_LONG;
    break;
  case TYPE_INT32:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    field_local._4_4_ = JAVATYPE_INT;
    break;
  case TYPE_BOOL:
    field_local._4_4_ = JAVATYPE_BOOLEAN;
    break;
  case TYPE_STRING:
    field_local._4_4_ = JAVATYPE_STRING;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    field_local._4_4_ = JAVATYPE_MESSAGE;
    break;
  case TYPE_BYTES:
    field_local._4_4_ = JAVATYPE_BYTES;
    break;
  case TYPE_ENUM:
    field_local._4_4_ = JAVATYPE_ENUM;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x193);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    field_local._4_4_ = JAVATYPE_INT;
  }
  return field_local._4_4_;
}

Assistant:

JavaType GetJavaType(const FieldDescriptor* field) {
  switch (GetType(field)) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
      return JAVATYPE_INT;

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      return JAVATYPE_LONG;

    case FieldDescriptor::TYPE_FLOAT:
      return JAVATYPE_FLOAT;

    case FieldDescriptor::TYPE_DOUBLE:
      return JAVATYPE_DOUBLE;

    case FieldDescriptor::TYPE_BOOL:
      return JAVATYPE_BOOLEAN;

    case FieldDescriptor::TYPE_STRING:
      return JAVATYPE_STRING;

    case FieldDescriptor::TYPE_BYTES:
      return JAVATYPE_BYTES;

    case FieldDescriptor::TYPE_ENUM:
      return JAVATYPE_ENUM;

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return JAVATYPE_MESSAGE;

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return JAVATYPE_INT;
}